

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl3cTransformFeedbackTests.cpp
# Opt level: O2

void __thiscall
gl3cts::TransformFeedback::CaptureVertexSeparate::cleanBuffer(CaptureVertexSeparate *this)

{
  long lVar1;
  
  lVar1 = (**(code **)(**(long **)(*(long *)(&this->field_0x78 +
                                            (long)this->_vptr_CaptureVertexSeparate[-3]) + 8) + 0x18
                      ))();
  if (this->m_buffers != (GLuint *)0x0) {
    (**(code **)(lVar1 + 0x438))(this->m_max_transform_feedback_separate_attribs);
    if (this->m_buffers != (GLuint *)0x0) {
      operator_delete__(this->m_buffers);
    }
    this->m_buffers = (GLuint *)0x0;
  }
  return;
}

Assistant:

void gl3cts::TransformFeedback::CaptureVertexSeparate::cleanBuffer(void)
{
	/* Functions handler */
	const glw::Functions& gl = m_context.getRenderContext().getFunctions();

	if (DE_NULL != m_buffers)
	{
		gl.deleteBuffers(m_max_transform_feedback_separate_attribs, m_buffers);

		delete[] m_buffers;

		m_buffers = DE_NULL;
	}
}